

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

bool __thiscall
cfd::TransactionController::VerifyInputSignature
          (TransactionController *this,ByteData *signature,Pubkey *pubkey,Txid *txid,uint32_t vout,
          Script *script,SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  byte bVar1;
  Pubkey *in_RDX;
  Amount *in_RSI;
  WitnessVersion in_EDI;
  undefined4 in_R8D;
  Txid *in_R9;
  SigHashType *in_stack_00000008;
  ByteData sighash;
  undefined7 in_stack_ffffffffffffff30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ByteData256 local_70;
  SigHashType local_54;
  SigHashType *in_stack_ffffffffffffffb8;
  Script *in_stack_ffffffffffffffc0;
  uint32_t in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  
  core::SigHashType::SigHashType(&local_54,in_stack_00000008);
  CreateSignatureHash((TransactionController *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_R9,
                      in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                      in_RSI,in_EDI);
  core::ByteData::GetBytes(&local_88,(ByteData *)&stack0xffffffffffffffb8);
  core::ByteData256::ByteData256(&local_70,&local_88);
  bVar1 = core::SignatureUtil::VerifyEcSignature(&local_70,in_RDX,(ByteData *)in_RSI);
  core::ByteData256::~ByteData256((ByteData256 *)0x513e55);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(bVar1,in_stack_ffffffffffffff30));
  core::ByteData::~ByteData((ByteData *)0x513e6c);
  return (bool)(bVar1 & 1);
}

Assistant:

bool TransactionController::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const Txid& txid,
    uint32_t vout, const Script& script, SigHashType sighash_type,
    const Amount& value, WitnessVersion version) const {
  auto sighash = this->CreateSignatureHash(
      txid, vout, script, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}